

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_rand_bytes(void *data_,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (len != 0 && data_ != (void *)0x0) {
    if (0x1f < len) {
      uVar6 = len >> 5;
      do {
        uVar1 = fio_rand64();
        uVar2 = fio_rand64();
        uVar3 = fio_rand64();
        uVar4 = fio_rand64();
        *(char *)data_ = (char)(uVar1 >> 0x38);
        *(char *)((long)data_ + 1) = (char)(uVar1 >> 0x30);
        *(char *)((long)data_ + 2) = (char)(uVar1 >> 0x28);
        *(char *)((long)data_ + 3) = (char)(uVar1 >> 0x20);
        *(char *)((long)data_ + 4) = (char)(uVar1 >> 0x18);
        *(char *)((long)data_ + 5) = (char)(uVar1 >> 0x10);
        *(char *)((long)data_ + 6) = (char)(uVar1 >> 8);
        *(char *)((long)data_ + 7) = (char)uVar1;
        *(char *)((long)data_ + 8) = (char)(uVar2 >> 0x38);
        *(char *)((long)data_ + 9) = (char)(uVar2 >> 0x30);
        *(char *)((long)data_ + 10) = (char)(uVar2 >> 0x28);
        *(char *)((long)data_ + 0xb) = (char)(uVar2 >> 0x20);
        *(char *)((long)data_ + 0xc) = (char)(uVar2 >> 0x18);
        *(char *)((long)data_ + 0xd) = (char)(uVar2 >> 0x10);
        *(char *)((long)data_ + 0xe) = (char)(uVar2 >> 8);
        *(char *)((long)data_ + 0xf) = (char)uVar2;
        *(char *)((long)data_ + 0x10) = (char)(uVar3 >> 0x38);
        *(char *)((long)data_ + 0x11) = (char)(uVar3 >> 0x30);
        *(char *)((long)data_ + 0x12) = (char)(uVar3 >> 0x28);
        *(char *)((long)data_ + 0x13) = (char)(uVar3 >> 0x20);
        *(char *)((long)data_ + 0x14) = (char)(uVar3 >> 0x18);
        *(char *)((long)data_ + 0x15) = (char)(uVar3 >> 0x10);
        *(char *)((long)data_ + 0x16) = (char)(uVar3 >> 8);
        *(char *)((long)data_ + 0x17) = (char)uVar3;
        *(char *)((long)data_ + 0x18) = (char)(uVar4 >> 0x38);
        *(char *)((long)data_ + 0x19) = (char)(uVar4 >> 0x30);
        *(char *)((long)data_ + 0x1a) = (char)(uVar4 >> 0x28);
        *(char *)((long)data_ + 0x1b) = (char)(uVar4 >> 0x20);
        *(char *)((long)data_ + 0x1c) = (char)(uVar4 >> 0x18);
        *(char *)((long)data_ + 0x1d) = (char)(uVar4 >> 0x10);
        *(char *)((long)data_ + 0x1e) = (char)(uVar4 >> 8);
        *(char *)((long)data_ + 0x1f) = (char)uVar4;
        data_ = (void *)((long)data_ + 0x20);
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    uVar5 = (uint)len & 0x18;
    switch(uVar5) {
    case 0x18:
      uVar1 = fio_rand64();
      *(uint64_t *)((long)data_ + 0x10) =
           uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    case 0x10:
      uVar1 = fio_rand64();
      *(uint64_t *)((long)data_ + 8) =
           uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    case 8:
      uVar1 = fio_rand64();
      *(uint64_t *)data_ =
           uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      data_ = (void *)((long)data_ + (ulong)uVar5);
    }
    if ((len & 7) != 0) {
      uVar1 = fio_rand64();
      switch(len & 7) {
      case 7:
        *(char *)((long)data_ + 6) = (char)(uVar1 >> 8);
      case 6:
        *(char *)((long)data_ + 5) = (char)(uVar1 >> 0x10);
      case 5:
        *(char *)((long)data_ + 4) = (char)(uVar1 >> 0x18);
      case 4:
        *(char *)((long)data_ + 3) = (char)(uVar1 >> 0x20);
      case 3:
        *(char *)((long)data_ + 2) = (char)(uVar1 >> 0x28);
      case 2:
        *(char *)((long)data_ + 1) = (char)(uVar1 >> 0x30);
      case 1:
        *(char *)data_ = (char)(uVar1 >> 0x38);
      }
    }
  }
  return;
}

Assistant:

void fio_rand_bytes(void *data_, size_t len) {
  if (!data_ || !len)
    return;
  uint8_t *data = data_;
  /* unroll 32 bytes / 256 bit writes */
  for (size_t i = (len >> 5); i; --i) {
    const uint64_t t0 = fio_rand64();
    const uint64_t t1 = fio_rand64();
    const uint64_t t2 = fio_rand64();
    const uint64_t t3 = fio_rand64();
    fio_u2str64(data, t0);
    fio_u2str64(data + 8, t1);
    fio_u2str64(data + 16, t2);
    fio_u2str64(data + 24, t3);
    data += 32;
  }
  uint64_t tmp;
  /* 64 bit steps  */
  switch (len & 24) {
  case 24:
    tmp = fio_rand64();
    fio_u2str64(data + 16, tmp);
    /* fallthrough */
  case 16:
    tmp = fio_rand64();
    fio_u2str64(data + 8, tmp);
    /* fallthrough */
  case 8:
    tmp = fio_rand64();
    fio_u2str64(data, tmp);
    data += len & 24;
  }
  if ((len & 7)) {
    tmp = fio_rand64();
    /* leftover bytes */
    switch ((len & 7)) {
    case 7:
      data[6] = (tmp >> 8) & 0xFF;
      /* fallthrough */
    case 6:
      data[5] = (tmp >> 16) & 0xFF;
      /* fallthrough */
    case 5:
      data[4] = (tmp >> 24) & 0xFF;
      /* fallthrough */
    case 4:
      data[3] = (tmp >> 32) & 0xFF;
      /* fallthrough */
    case 3:
      data[2] = (tmp >> 40) & 0xFF;
      /* fallthrough */
    case 2:
      data[1] = (tmp >> 48) & 0xFF;
      /* fallthrough */
    case 1:
      data[0] = (tmp >> 56) & 0xFF;
    }
  }
}